

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

CBString * errorCodeToUString(CBString *__return_storage_ptr__,USTATUS errorCode)

{
  char *s;
  
  switch(errorCode) {
  case 0:
    s = "Success";
    break;
  case 1:
    s = "Function called with invalid parameter";
    break;
  case 2:
    s = "Buffer too small";
    break;
  case 3:
    s = "Out of resources";
    break;
  case 4:
    s = "Out of memory";
    break;
  case 5:
    s = "File can\'t be opened";
    break;
  case 6:
    s = "File can\'t be read";
    break;
  case 7:
    s = "File can\'t be written";
    break;
  case 8:
    s = "Item not found";
    break;
  case 9:
    s = "Unknown item type";
    break;
  case 10:
    s = "Invalid flash descriptor";
    break;
  case 0xb:
    s = "Invalid region";
    break;
  case 0xc:
    s = "Empty region";
    break;
  case 0xd:
    s = "BIOS region not found";
    break;
  case 0xe:
    s = "UEFI volumes not found";
    break;
  case 0xf:
    s = "Invalid UEFI volume";
    break;
  case 0x10:
    s = "Volume revision not supported";
    break;
  case 0x11:
    s = "Block map structure too complex for correct analysis";
    break;
  case 0x12:
    s = "Unknown file system";
    break;
  case 0x13:
    s = "Invalid file";
    break;
  case 0x14:
    s = "Invalid section";
    break;
  case 0x15:
    s = "Unknown section";
    break;
  case 0x16:
    s = "Standard compression failed";
    break;
  case 0x17:
    s = "Customized compression failed";
    break;
  case 0x18:
    s = "Standard decompression failed";
    break;
  case 0x19:
    s = "Customized decompression failed";
    break;
  case 0x1a:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
switchD_0012e588_caseD_1a:
    usprintf(__return_storage_ptr__,"Unknown error %02lX");
    return __return_storage_ptr__;
  case 0x1b:
    s = "Unknown compression type";
    break;
  case 0x1c:
    s = "Dependency expression parsing failed";
    break;
  case 0x1d:
    s = "Unknown extract mode";
    break;
  case 0x1e:
    s = "Unknown replace mode";
    break;
  case 0x1f:
    s = "Unknown executable image type";
    break;
  case 0x20:
    s = "Unknown PE optional header type";
    break;
  case 0x21:
    s = "Unknown relocation type";
    break;
  case 0x22:
    s = "Directory already exists";
    break;
  case 0x23:
    s = "Directory can\'t be created";
    break;
  case 0x24:
    s = "Change directory failed";
    break;
  case 0x25:
    s = "Image is truncated";
    break;
  case 0x26:
    s = "Invalid capsule";
    break;
  case 0x27:
    s = "Stores not found";
    break;
  case 0x32:
    s = "Invalid store size";
    break;
  case 0x39:
    s = "Invalid store";
    break;
  default:
    if (errorCode != 0xff) goto switchD_0012e588_caseD_1a;
    s = "Not implemented";
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString errorCodeToUString(USTATUS errorCode)
{
    // TODO: improve
    switch (errorCode) {
        case U_SUCCESS:                         return UString("Success");
        case U_NOT_IMPLEMENTED:                 return UString("Not implemented");
        case U_INVALID_PARAMETER:               return UString("Function called with invalid parameter");
        case U_BUFFER_TOO_SMALL:                return UString("Buffer too small");
        case U_OUT_OF_RESOURCES:                return UString("Out of resources");
        case U_OUT_OF_MEMORY:                   return UString("Out of memory");
        case U_FILE_OPEN:                       return UString("File can't be opened");
        case U_FILE_READ:                       return UString("File can't be read");
        case U_FILE_WRITE:                      return UString("File can't be written");
        case U_ITEM_NOT_FOUND:                  return UString("Item not found");
        case U_UNKNOWN_ITEM_TYPE:               return UString("Unknown item type");
        case U_INVALID_FLASH_DESCRIPTOR:        return UString("Invalid flash descriptor");
        case U_INVALID_REGION:                  return UString("Invalid region");
        case U_EMPTY_REGION:                    return UString("Empty region");
        case U_BIOS_REGION_NOT_FOUND:           return UString("BIOS region not found");
        case U_VOLUMES_NOT_FOUND:               return UString("UEFI volumes not found");
        case U_INVALID_VOLUME:                  return UString("Invalid UEFI volume");
        case U_VOLUME_REVISION_NOT_SUPPORTED:   return UString("Volume revision not supported");
        case U_UNKNOWN_FFS:                     return UString("Unknown file system");
        case U_INVALID_FILE:                    return UString("Invalid file");
        case U_INVALID_SECTION:                 return UString("Invalid section");
        case U_UNKNOWN_SECTION:                 return UString("Unknown section");
        case U_STANDARD_COMPRESSION_FAILED:     return UString("Standard compression failed");
        case U_CUSTOMIZED_COMPRESSION_FAILED:   return UString("Customized compression failed");
        case U_STANDARD_DECOMPRESSION_FAILED:   return UString("Standard decompression failed");
        case U_CUSTOMIZED_DECOMPRESSION_FAILED: return UString("Customized decompression failed");
        case U_UNKNOWN_COMPRESSION_TYPE:        return UString("Unknown compression type");
        case U_UNKNOWN_EXTRACT_MODE:            return UString("Unknown extract mode");
        case U_UNKNOWN_REPLACE_MODE:            return UString("Unknown replace mode");
        case U_UNKNOWN_IMAGE_TYPE:              return UString("Unknown executable image type");
        case U_UNKNOWN_PE_OPTIONAL_HEADER_TYPE: return UString("Unknown PE optional header type");
        case U_UNKNOWN_RELOCATION_TYPE:         return UString("Unknown relocation type");
        case U_COMPLEX_BLOCK_MAP:               return UString("Block map structure too complex for correct analysis");
        case U_DIR_ALREADY_EXIST:               return UString("Directory already exists");
        case U_DIR_CREATE:                      return UString("Directory can't be created");
        case U_DIR_CHANGE:                      return UString("Change directory failed");
        case U_DEPEX_PARSE_FAILED:              return UString("Dependency expression parsing failed");
        case U_TRUNCATED_IMAGE:                 return UString("Image is truncated");
        case U_INVALID_CAPSULE:                 return UString("Invalid capsule");
        case U_STORES_NOT_FOUND:                return UString("Stores not found");
        case U_INVALID_STORE_SIZE:              return UString("Invalid store size");
        case U_INVALID_STORE:                   return UString("Invalid store");
        default:                                return usprintf("Unknown error %02lX", errorCode);
    }
}